

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *obj1;
  SQRESULT SVar2;
  SQObjectPtr res;
  
  obj1 = stack_get(v,idx);
  res.super_SQObject._type = OT_NULL;
  res.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = SQVM::TypeOf(v,obj1,&res);
  if (bVar1) {
    SQVM::Push(v,&res);
    SVar2 = 0;
  }
  else {
    SVar2 = -1;
  }
  SQObjectPtr::~SQObjectPtr(&res);
  return SVar2;
}

Assistant:

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectPtr res;
    if(!v->TypeOf(o,res)) {
        return SQ_ERROR;
    }
    v->Push(res);
    return SQ_OK;
}